

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerSettings.cpp
# Opt level: O0

void __thiscall MDIOAnalyzerSettings::MDIOAnalyzerSettings(MDIOAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *pAVar1;
  element_type *peVar2;
  ulong uVar3;
  Channel *pCVar4;
  uint uVar5;
  MDIOAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__MDIOAnalyzerSettings_00111d68;
  Channel::Channel(&this->mMdioChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mMdcChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mMdioChannelInterface,(element_type *)0x0);
  uVar3 = 0;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mMdcChannelInterface,(element_type *)0x0);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar3);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mMdioChannelInterface,pAVar1);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mMdioChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"MDIO");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mMdioChannelInterface);
  pCVar4 = &this->mMdioChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar2);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mMdcChannelInterface,pAVar1);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mMdcChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"MDC");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mMdcChannelInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar2);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mMdioChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mMdcChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar5 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar5,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mMdioChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mMdcChannel,true);
  return;
}

Assistant:

MDIOAnalyzerSettings::MDIOAnalyzerSettings() : mMdioChannel( UNDEFINED_CHANNEL ), mMdcChannel( UNDEFINED_CHANNEL )
{
    mMdioChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mMdioChannelInterface->SetTitleAndTooltip( "MDIO", "MDIO data bus" );
    mMdioChannelInterface->SetChannel( mMdioChannel );

    mMdcChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mMdcChannelInterface->SetTitleAndTooltip( "MDC", "MDIO clock line " );
    mMdcChannelInterface->SetChannel( mMdcChannel );

    AddInterface( mMdioChannelInterface.get() );
    AddInterface( mMdcChannelInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mMdioChannel, "MDIO", false );
    AddChannel( mMdcChannel, "MDC", false );
}